

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reduce.cpp
# Opt level: O1

void transform_reduce_sum<tf::GuidedPartitioner<tf::DefaultClosureWrapper>>(uint W)

{
  int *piVar1;
  code *pcVar2;
  double dVar3;
  pointer puVar4;
  pointer puVar5;
  char extraout_AL;
  bool bVar6;
  int iVar7;
  long lVar8;
  Executor *this;
  pointer *__ptr;
  default_delete<tf::Node> *this_00;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar9;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar10;
  in_place_type_t<tf::Node::Runtime> local_352;
  DefaultTaskParams local_351;
  int sol;
  int sum;
  Task ptask;
  undefined8 local_340;
  undefined4 local_334;
  vector<Data,_std::allocator<Data>_> vec;
  iterator end;
  iterator beg;
  Expression_lhs<const_int_&> local_300;
  Result local_2f0;
  ResultBuilder DOCTEST_RB;
  Task stask;
  shared_ptr<tf::WorkerInterface> local_248;
  Taskflow taskflow;
  Executor executor;
  
  local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,(ulong)W,&local_248);
  if (local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  taskflow.super_FlowBuilder._graph = &taskflow._graph;
  taskflow._mutex.super___mutex_base._M_mutex.__align = 0;
  taskflow._mutex.super___mutex_base._M_mutex._8_8_ = 0;
  taskflow._mutex.super___mutex_base._M_mutex._16_8_ = 0;
  taskflow._mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  taskflow._mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  taskflow._name._M_dataplus._M_p = (pointer)&taskflow._name.field_2;
  taskflow._name._M_string_length = 0;
  taskflow._name.field_2._M_local_buf[0] = '\0';
  taskflow._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  taskflow._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  taskflow._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
  _M_initialize_map((_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
                     *)&taskflow._topologies,0);
  taskflow._satellite.super__Optional_base<std::_List_iterator<tf::Taskflow>,_true,_true>._M_payload
  .super__Optional_payload_base<std::_List_iterator<tf::Taskflow>_>._M_engaged = false;
  std::vector<Data,_std::allocator<Data>_>::vector(&vec,1000,(allocator_type *)&DOCTEST_RB);
  local_340 = 1;
  if (4 < (ulong)((long)vec.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)vec.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                       super__Vector_impl_data._M_start)) {
    lVar8 = 0;
    do {
      do {
        puVar5 = taskflow._graph.
                 super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        puVar4 = taskflow._graph.
                 super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar7 = *(int *)((long)&DAT_0016cca8 + lVar8);
        sum = 100;
        sol = 100;
        beg._M_current =
             vec.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        end._M_current =
             vec.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        this_00 = (default_delete<tf::Node> *)
                  taskflow._graph.
                  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                  .
                  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (taskflow._graph.
            super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            .
            super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            taskflow._graph.
            super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            .
            super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          do {
            if (*(Node **)this_00 != (Node *)0x0) {
              std::default_delete<tf::Node>::operator()(this_00,*(Node **)this_00);
            }
            *(undefined8 *)this_00 = 0;
            this_00 = this_00 + 8;
          } while (this_00 != (default_delete<tf::Node> *)puVar5);
          taskflow._graph.
          super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
          .
          super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = puVar4;
        }
        DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)&beg;
        DOCTEST_RB.super_AssertData._8_8_ = &vec;
        DOCTEST_RB.super_AssertData.m_file = (char *)&end;
        DOCTEST_RB.super_AssertData._24_8_ = &local_340;
        DOCTEST_RB.super_AssertData.m_expr = (char *)&sum;
        local_2f0.m_passed = false;
        local_2f0._1_7_ = 0;
        local_300.lhs = (int *)0x0;
        ptask._node = ptask._node & 0xffffffff00000000;
        stask._node = tf::Graph::
                      _emplace_back<int_const&,int_const&,tf::DefaultTaskParams,decltype(nullptr),decltype(nullptr),int,std::in_place_type_t<tf::Node::Static>,transform_reduce_sum<tf::GuidedPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda()_1_>
                                (taskflow.super_FlowBuilder._graph,&tf::NSTATE::NONE,
                                 &tf::ESTATE::NONE,(DefaultTaskParams *)&local_334,
                                 (void **)&local_2f0,&local_300.lhs,(int *)&ptask,
                                 (in_place_type_t<tf::Node::Static> *)&local_351,
                                 (anon_class_40_5_33a24316 *)&DOCTEST_RB);
        ptask._node = (Node *)0x0;
        DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)&sol;
        DOCTEST_RB.super_AssertData._8_8_ = &beg;
        DOCTEST_RB.super_AssertData.m_file = (char *)&end;
        local_2f0.m_passed = false;
        local_2f0._1_7_ = 0;
        local_300.lhs = (int *)0x0;
        local_334 = 0;
        DOCTEST_RB.super_AssertData._24_8_ = (long)iVar7;
        ptask._node = tf::Graph::
                      _emplace_back<int_const&,int_const&,tf::DefaultTaskParams,decltype(nullptr),decltype(nullptr),int,std::in_place_type_t<tf::Node::Runtime>,tf::make_transform_reduce_task<std::reference_wrapper<__gnu_cxx::__normal_iterator<Data*,std::vector<Data,std::allocator<Data>>>>,std::reference_wrapper<__gnu_cxx::__normal_iterator<Data*,std::vector<Data,std::allocator<Data>>>>,int,transform_reduce_sum<tf::GuidedPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda(int,int)_1_,transform_reduce_sum<tf::GuidedPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda(Data_const&)_1_,tf::GuidedPartitioner<tf::DefaultClosureWrapper>>(std::reference_wrapper<__gnu_cxx::__normal_iterator<Data*,std::vector<Data,std::allocator<Data>>>>,std::reference_wrapper<__gnu_cxx::__normal_iterator<Data*,std::vector<Data,std::allocator<Data>>>>,int&,transform_reduce_sum<tf::GuidedPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda(int,int)_1_,transform_reduce_sum<tf::GuidedPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda(Data_const&)_1_,tf::GuidedPartitioner<tf::DefaultClosureWrapper>)::_lambda(tf::Runtime&)_1_>
                                (taskflow.super_FlowBuilder._graph,&tf::NSTATE::NONE,
                                 &tf::ESTATE::NONE,&local_351,(void **)&local_2f0,&local_300.lhs,
                                 (int *)&local_334,&local_352,
                                 (anon_class_48_6_3af2c317 *)&DOCTEST_RB);
        tf::Task::precede<tf::Task&>(&stask,&ptask);
        local_2f0.m_passed = true;
        local_2f0._1_7_ = 0;
        this = &executor;
        tf::Executor::
        run_until<tf::Executor::run_n<tf::Executor::run(tf::Taskflow&)::_lambda()_1_>(tf::Taskflow&,unsigned_long,tf::Executor::run(tf::Taskflow&)::_lambda()_1_&&)::_lambda()_1_,tf::Executor::run(tf::Taskflow&)::_lambda()_1_>
                  ((Future<void> *)&DOCTEST_RB,this,&taskflow,(anon_class_8_1_69701ed9 *)&local_2f0,
                   (anon_class_1_0_00000001 *)&local_300);
        if (DOCTEST_RB.super_AssertData.m_test_case == (TestCaseData *)0x0) {
          std::__throw_future_error(3);
LAB_001513b3:
          doctest::detail::throwException();
        }
        std::__future_base::_State_baseV2::wait
                  ((_State_baseV2 *)DOCTEST_RB.super_AssertData.m_test_case,this);
        if (DOCTEST_RB.super_AssertData._24_8_ != 0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            piVar1 = (int *)(DOCTEST_RB.super_AssertData._24_8_ + 0xc);
            iVar7 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
          }
          else {
            iVar7 = *(int *)(DOCTEST_RB.super_AssertData._24_8_ + 0xc);
            *(int *)(DOCTEST_RB.super_AssertData._24_8_ + 0xc) = iVar7 + -1;
          }
          if (iVar7 == 1) {
            (**(code **)(*(long *)DOCTEST_RB.super_AssertData._24_8_ + 0x18))();
          }
        }
        if (DOCTEST_RB.super_AssertData._8_8_ != 0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     DOCTEST_RB.super_AssertData._8_8_);
        }
        DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
        DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
        DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0] = '\0';
        DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
        DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
        DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
        DOCTEST_RB.super_AssertData.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_reduce.cpp"
        ;
        DOCTEST_RB.super_AssertData.m_line = 0x3e0;
        DOCTEST_RB.super_AssertData.m_expr = "sol == sum";
        DOCTEST_RB.super_AssertData.m_failed = true;
        DOCTEST_RB.super_AssertData.m_threw = false;
        DOCTEST_RB.super_AssertData.m_threw_as = false;
        DOCTEST_RB.super_AssertData.m_exception_type = "";
        DOCTEST_RB.super_AssertData.m_exception_string = "";
        local_300.lhs = &sol;
        local_300.m_at = 0xc;
        doctest::detail::Expression_lhs<const_int_&>::operator==<int,_nullptr>
                  (&local_2f0,&local_300,&sum);
        doctest::String::operator=(&DOCTEST_RB.super_AssertData.m_decomp,&local_2f0.m_decomp);
        DOCTEST_RB.super_AssertData._40_2_ =
             CONCAT11(DOCTEST_RB.super_AssertData.m_threw,local_2f0.m_passed) ^ 1;
        uVar9 = extraout_XMM0_Da;
        uVar10 = extraout_XMM0_Db;
        if ((local_2f0.m_decomp.field_0.buf[0x17] < '\0') &&
           (local_2f0.m_decomp.field_0.data.ptr != (char *)0x0)) {
          operator_delete__(local_2f0.m_decomp.field_0.data.ptr);
          uVar9 = extraout_XMM0_Da_00;
          uVar10 = extraout_XMM0_Db_00;
        }
        dVar3 = doctest::detail::ResultBuilder::log(&DOCTEST_RB,(double)CONCAT44(uVar10,uVar9));
        if (extraout_AL != '\0') {
          pcVar2 = (code *)swi(3);
          (*pcVar2)(SUB84(dVar3,0));
          return;
        }
        if (DOCTEST_RB.super_AssertData.m_failed == true) {
          bVar6 = doctest::detail::checkIfShouldThrow(DOCTEST_RB.super_AssertData.m_at);
          if (bVar6) goto LAB_001513b3;
        }
        if ((DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
           ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                             DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
          operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_decomp.field_0._1_7_,
                                             DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0]));
        }
        if ((DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
           ((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                             DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)
           ) {
          operator_delete__((void *)CONCAT71(DOCTEST_RB.super_AssertData.m_exception.field_0._1_7_,
                                             DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0])
                           );
        }
        lVar8 = lVar8 + 4;
      } while (lVar8 != 0x14);
      local_340 = local_340 + 1;
      lVar8 = 0;
    } while ((ulong)local_340 <
             (ulong)((long)vec.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)vec.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2));
  }
  if (vec.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(vec.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)vec.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vec.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  tf::Taskflow::~Taskflow(&taskflow);
  tf::Executor::~Executor(&executor);
  return;
}

Assistant:

void transform_reduce_sum(unsigned W) {

  tf::Executor executor(W);
  tf::Taskflow taskflow;

  std::vector<Data> vec(1000);

  for(size_t n=1; n<vec.size(); n++) {
    for(size_t c : {0, 1, 3, 7, 99}) {

      auto sum = 100;
      auto sol = 100;
      auto beg = vec.end();
      auto end = vec.end();

      taskflow.clear();
      auto stask = taskflow.emplace([&](){
        beg = vec.begin();
        end = vec.begin() + n;
        for(auto itr = beg; itr != end; itr++) {
          sum += itr->get();
        }
      });

      tf::Task ptask;

      ptask = taskflow.transform_reduce(
        std::ref(beg), std::ref(end), sol,
        [] (int l, int r)   { return  l + r; },
        [] (const Data& data) { return data.get(); },
        P(c)
      );

      stask.precede(ptask);

      executor.run(taskflow).wait();

      REQUIRE(sol == sum);
    }
  }
}